

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O3

ptr<Value> __thiscall
PrimitiveExpression<Boolean>::evaluate(PrimitiveExpression<Boolean> *this,Environment *env)

{
  undefined1 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var2;
  ptr<Value> pVar3;
  
  pp_Var2 = (_func_int **)operator_new(0x20);
  pp_Var2[1] = (_func_int *)0x100000001;
  *pp_Var2 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f620;
  pp_Var2[2] = (_func_int *)&PTR__Member_0012f670;
  uVar1 = *(undefined1 *)&(env->symbols)._M_h._M_before_begin._M_nxt;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_7_ = 0x12f6;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ = uVar1;
  *(undefined1 *)(pp_Var2 + 3) = uVar1;
  (this->super_Expression)._vptr_Expression = pp_Var2 + 2;
  (this->value).super_Value.super_Member._vptr_Member = pp_Var2;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        return make<T>(value);
    }